

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O0

int fy_parser_reset(fy_parser *fyp)

{
  int rc;
  fy_parser *fyp_local;
  
  if (fyp == (fy_parser *)0x0) {
    fyp_local._4_4_ = -1;
  }
  else {
    fy_parse_input_reset(fyp);
    fy_input_unref(fyp->current_input);
    fyp->current_input = (fy_input *)0x0;
    fyp->current_pos = 0;
    fyp->current_input_pos = 0;
    fyp->current_ptr = (void *)0x0;
    fyp->current_c = -1;
    fyp->current_w = 0;
    fyp->current_left = 0;
    fyp->line = 0;
    fyp->column = 0;
    fyp->nontab_column = 0;
    fyp->next_single_document = false;
    *(ushort *)&fyp->field_0x70 = *(ushort *)&fyp->field_0x70 & 0xffef;
    *(ushort *)&fyp->field_0x70 = *(ushort *)&fyp->field_0x70 & 0xffdf;
    *(ushort *)&fyp->field_0x70 = *(ushort *)&fyp->field_0x70 & 0xffbf;
    *(ushort *)&fyp->field_0x70 = *(ushort *)&fyp->field_0x70 & 0xff7f;
    *(ushort *)&fyp->field_0x70 = *(ushort *)&fyp->field_0x70 & 0xfeff;
    *(ushort *)&fyp->field_0x70 = *(ushort *)&fyp->field_0x70 & 0xfdff;
    *(ushort *)&fyp->field_0x70 = *(ushort *)&fyp->field_0x70 & 0xfbff;
    if (fyp->diag == (fy_diag *)0x0) {
      __assert_fail("fyp->diag",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                    ,0x144c,"int fy_parser_reset(struct fy_parser *)");
    }
    fyp->diag->field_0x3c = fyp->diag->field_0x3c & 0xfe;
    fyp_local._4_4_ = fy_reset_document_state(fyp);
    if (fyp_local._4_4_ == 0) {
      fyp_local._4_4_ = 0;
    }
    else {
      fy_parser_diag(fyp,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                     ,0x1451,"fy_parser_reset","fy_parse_input_reset() failed");
    }
  }
  return fyp_local._4_4_;
}

Assistant:

int fy_parser_reset(struct fy_parser *fyp) {
    int rc;

    if (!fyp)
        return -1;

    fy_parse_input_reset(fyp);

    fy_input_unref(fyp->current_input);

    fyp->current_input = NULL;
    fyp->current_pos = 0;
    fyp->current_input_pos = 0;
    fyp->current_ptr = NULL;
    fyp->current_c = -1;
    fyp->current_w = 0;
    fyp->current_left = 0;
    fyp->line = 0;
    fyp->column = 0;
    fyp->nontab_column = 0;

    fyp->next_single_document = false;
    fyp->stream_error = false;
    fyp->generated_block_map = false;
    fyp->last_was_comma = false;
    fyp->document_has_content = false;
    fyp->document_first_content_token = false;
    fyp->bare_document_only = false;
    fyp->stream_has_content = false;

    assert(fyp->diag);
    fyp->diag->on_error = false;

    rc = fy_reset_document_state(fyp);
    fyp_error_check(fyp, !rc, err_out_rc,
                    "fy_parse_input_reset() failed");

    return 0;
    err_out_rc:
    return rc;
}